

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::ConsoleReporter::lazyPrintGroupInfo(ConsoleReporter *this)

{
  GroupInfo *pGVar1;
  pointer pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  pGVar1 = (this->super_StreamingReporterBase).unusedGroupInfo.nullableValue;
  if (((pGVar1->name)._M_string_length != 0) && (1 < pGVar1->groupsCounts)) {
    std::operator+(&local_30,"Group: ",&pGVar1->name);
    printClosedHeader(this,&local_30);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p);
    }
    pGVar1 = (this->super_StreamingReporterBase).unusedGroupInfo.nullableValue;
    if ((pGVar1 != (GroupInfo *)0x0) &&
       (pcVar2 = (pGVar1->name)._M_dataplus._M_p,
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)pcVar2 != &(pGVar1->name).field_2)) {
      operator_delete(pcVar2);
    }
    (this->super_StreamingReporterBase).unusedGroupInfo.nullableValue = (GroupInfo *)0x0;
  }
  return;
}

Assistant:

T* operator->() { return nullableValue; }